

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O1

APInt __thiscall llvm::APIntOps::RoundingSDiv(APIntOps *this,APInt *A,APInt *B,Rounding RM)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  ulong uVar5;
  anon_union_8_2_1313ab2f_for_U *this_00;
  anon_union_8_2_1313ab2f_for_U *paVar6;
  APInt AVar7;
  APInt Rem;
  anon_union_8_2_1313ab2f_for_U local_68;
  uint local_60 [2];
  anon_union_8_2_1313ab2f_for_U local_58;
  uint local_50;
  anon_union_8_2_1313ab2f_for_U local_48;
  uint local_40;
  anon_union_8_2_1313ab2f_for_U local_38;
  uint local_30;
  undefined8 uVar4;
  
  this_00 = &local_68;
  paVar6 = &local_68;
  if (RM != UP) {
    if (RM == TOWARD_ZERO) {
      AVar7 = APInt::sdiv((APInt *)this,A);
      uVar4 = AVar7._8_8_;
      goto LAB_001c723f;
    }
    if (RM != DOWN) {
      llvm_unreachable_internal
                ("Unknown APInt::Rounding enum",
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                 ,0xa94);
    }
  }
  local_60[0] = 1;
  local_68.VAL = 0;
  local_30 = 1;
  local_38.VAL = 0;
  APInt::sdivrem(A,B,(APInt *)&local_68,(APInt *)&local_38);
  bVar1 = APInt::operator==((APInt *)&local_38,0);
  uVar4 = extraout_RDX;
  uVar3 = local_60[0];
  if (bVar1) {
LAB_001c7203:
    *(uint *)(this + 8) = uVar3;
    paVar6 = this_00;
  }
  else {
    bVar1 = APInt::operator[]((APInt *)&local_38,local_30 - 1);
    bVar2 = APInt::operator[](B,B->BitWidth - 1);
    if (RM == DOWN) {
      if (bVar2 != bVar1) {
        local_40 = local_60[0];
        if (local_60[0] < 0x41) {
          local_48.VAL = local_68.VAL;
        }
        else {
          uVar5 = (ulong)((uint)((ulong)local_60[0] + 0x3f >> 3) & 0xfffffff8);
          local_48.pVal = (uint64_t *)operator_new__(uVar5);
          memcpy(local_48.pVal,local_68.pVal,uVar5);
        }
        this_00 = &local_48;
        APInt::operator-=((APInt *)this_00,1);
        uVar4 = extraout_RDX_02;
        goto LAB_001c71ff;
      }
    }
    else if (bVar2 == bVar1) {
      local_50 = local_60[0];
      if (local_60[0] < 0x41) {
        local_58.VAL = local_68.VAL;
      }
      else {
        uVar5 = (ulong)((uint)((ulong)local_60[0] + 0x3f >> 3) & 0xfffffff8);
        local_58.pVal = (uint64_t *)operator_new__(uVar5);
        memcpy(local_58.pVal,local_68.pVal,uVar5);
      }
      this_00 = &local_58;
      APInt::operator+=((APInt *)this_00,1);
      uVar4 = extraout_RDX_01;
LAB_001c71ff:
      uVar3 = *(uint *)(this_00 + 1);
      goto LAB_001c7203;
    }
    *(uint *)(this + 8) = local_60[0];
    uVar4 = extraout_RDX_00;
  }
  *(anon_union_8_2_1313ab2f_for_U *)this = *paVar6;
  *(uint *)(paVar6 + 1) = 0;
  if ((0x40 < local_30) && ((void *)local_38.VAL != (void *)0x0)) {
    operator_delete__(local_38.pVal);
    uVar4 = extraout_RDX_03;
  }
  if ((0x40 < local_60[0]) && ((void *)local_68.VAL != (void *)0x0)) {
    operator_delete__(local_68.pVal);
    uVar4 = extraout_RDX_04;
  }
LAB_001c723f:
  AVar7._8_8_ = uVar4;
  AVar7.U.pVal = (uint64_t *)this;
  return AVar7;
}

Assistant:

APInt llvm::APIntOps::RoundingSDiv(const APInt &A, const APInt &B,
                                   APInt::Rounding RM) {
  switch (RM) {
  case APInt::Rounding::DOWN:
  case APInt::Rounding::UP: {
    APInt Quo, Rem;
    APInt::sdivrem(A, B, Quo, Rem);
    if (Rem == 0)
      return Quo;
    // This algorithm deals with arbitrary rounding mode used by sdivrem.
    // We want to check whether the non-integer part of the mathematical value
    // is negative or not. If the non-integer part is negative, we need to round
    // down from Quo; otherwise, if it's positive or 0, we return Quo, as it's
    // already rounded down.
    if (RM == APInt::Rounding::DOWN) {
      if (Rem.isNegative() != B.isNegative())
        return Quo - 1;
      return Quo;
    }
    if (Rem.isNegative() != B.isNegative())
      return Quo;
    return Quo + 1;
  }
  // Currently sdiv rounds twards zero.
  case APInt::Rounding::TOWARD_ZERO:
    return A.sdiv(B);
  }
  llvm_unreachable("Unknown APInt::Rounding enum");
}